

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplexEpoll.cpp
# Opt level: O0

void __thiscall higan::MultiplexEpoll::~MultiplexEpoll(MultiplexEpoll *this)

{
  MultiplexEpoll *this_local;
  
  (this->super_MultiplexBase)._vptr_MultiplexBase = (_func_int **)&PTR_UpdateChannel_00169b98;
  close(this->epollfd_);
  std::vector<epoll_event,_std::allocator<epoll_event>_>::~vector(&this->epoll_events_);
  MultiplexBase::~MultiplexBase(&this->super_MultiplexBase);
  return;
}

Assistant:

MultiplexEpoll::~MultiplexEpoll()
{
	close(epollfd_);
}